

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O0

jint Java_beagle_BeagleJNIWrapper_addTransitionMatrices
               (JNIEnv *env,jobject obj,jint instance,jintArray inFirstIndices,
               jintArray inSecondIndices,jintArray inResultIndices,jint matrixCount)

{
  jint jVar1;
  JNIEnv_ *this;
  jintArray array;
  jint *elems;
  undefined4 in_EDX;
  jint *resultIndices;
  jint *secondIndices;
  jint *firstIndices;
  jint errCode;
  undefined4 in_stack_ffffffffffffffa8;
  jint in_stack_ffffffffffffffac;
  JNIEnv_ *in_stack_ffffffffffffffb0;
  
  this = (JNIEnv_ *)
         JNIEnv_::GetIntArrayElements
                   (in_stack_ffffffffffffffb0,
                    (jintArray)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (jboolean *)0x105488);
  array = (jintArray)
          JNIEnv_::GetIntArrayElements
                    (in_stack_ffffffffffffffb0,
                     (jintArray)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (jboolean *)0x1054a0);
  elems = JNIEnv_::GetIntArrayElements
                    (in_stack_ffffffffffffffb0,
                     (jintArray)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (jboolean *)0x1054b8);
  jVar1 = beagleAddTransitionMatrices(in_EDX,this,array,elems,resultIndices._0_4_);
  JNIEnv_::ReleaseIntArrayElements(this,array,elems,in_stack_ffffffffffffffac);
  JNIEnv_::ReleaseIntArrayElements(this,array,elems,in_stack_ffffffffffffffac);
  JNIEnv_::ReleaseIntArrayElements(this,array,elems,in_stack_ffffffffffffffac);
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_addTransitionMatrices
        (JNIEnv *env, jobject obj, jint instance, jintArray inFirstIndices, jintArray inSecondIndices, jintArray inResultIndices, jint matrixCount)
{
    jint errCode;

    jint *firstIndices = env->GetIntArrayElements(inFirstIndices, NULL);
    jint *secondIndices = env->GetIntArrayElements(inSecondIndices, NULL);
    jint *resultIndices = env->GetIntArrayElements(inResultIndices, NULL);

    errCode = (jint)beagleAddTransitionMatrices(instance, (int *)firstIndices, (int *)secondIndices, (int *)resultIndices, matrixCount);

    env->ReleaseIntArrayElements(inFirstIndices, firstIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inSecondIndices, secondIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inResultIndices, resultIndices, JNI_ABORT);

    return errCode;
}